

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  DecodeStatus DVar3;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t Address_01;
  uint64_t Address_02;
  uint RegNo;
  
  RegNo = Insn >> 0xc & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  Address_01 = Address_00;
  if (uVar2 == 0xd8) {
    DVar3 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_00,Decoder);
    bVar1 = true;
    if ((DVar3 != MCDisassembler_Success) && (DVar3 != MCDisassembler_SoftFail)) {
      bVar1 = false;
    }
    Address_01 = extraout_RDX;
    if (!bVar1) {
      return MCDisassembler_Fail;
    }
  }
  DVar3 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_01,Decoder);
  if (DVar3 == MCDisassembler_Fail) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((DVar3 != MCDisassembler_Success) && (DVar3 != MCDisassembler_SoftFail)) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    return MCDisassembler_Fail;
  }
  Decoder_00 = (void *)(ulong)(Insn & 0xfff);
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 4 & 0xf000 | Insn & 0xfff));
  DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_02,Decoder_00);
  DVar3 = (*(code *)(&DAT_001d568c + *(int *)(&DAT_001d568c + (ulong)DVar3 * 4)))();
  return DVar3;
}

Assistant:

static DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 12) << 0);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);

	if (MCInst_getOpcode(Inst) == ARM_MOVTi16)
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}